

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O0

void ZSTD_safecopyDstBeforeSrc(BYTE *op,BYTE *ip,ptrdiff_t length)

{
  BYTE *pBVar1;
  BYTE *oend;
  ptrdiff_t diff;
  ptrdiff_t length_local;
  BYTE *ip_local;
  BYTE *op_local;
  BYTE *oend_1;
  BYTE *op_1;
  BYTE *ip_1;
  ptrdiff_t diff_1;
  
  pBVar1 = op + length;
  length_local = (ptrdiff_t)ip;
  ip_local = op;
  if ((length < 8) || (-8 < (long)op - (long)ip)) {
    while (ip_local < pBVar1) {
      *ip_local = *(BYTE *)length_local;
      length_local = length_local + 1;
      ip_local = ip_local + 1;
    }
  }
  else {
    if ((op <= pBVar1 + -0x20) && ((long)op - (long)ip < -0x10)) {
      if (((long)op - (long)ip < 0x10) && (-0x10 < (long)op - (long)ip)) {
        __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/../common/zstd_internal.h"
                      ,0xe9,
                      "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)");
      }
      ZSTD_copy16(op,ip);
      if (0x10 < (long)(pBVar1 + (-0x20 - (long)op))) {
        oend_1 = op + 0x10;
        op_1 = ip + 0x10;
        do {
          ZSTD_copy16(oend_1,op_1);
          ZSTD_copy16(oend_1 + 0x10,op_1 + 0x10);
          oend_1 = oend_1 + 0x20;
          op_1 = op_1 + 0x20;
        } while (oend_1 < op + (long)(pBVar1 + (-0x20 - (long)op)));
      }
      length_local = (ptrdiff_t)(ip + (long)(pBVar1 + (-0x20 - (long)op)));
      ip_local = pBVar1 + -0x20;
    }
    while (ip_local < pBVar1) {
      *ip_local = *(BYTE *)length_local;
      length_local = length_local + 1;
      ip_local = ip_local + 1;
    }
  }
  return;
}

Assistant:

static void ZSTD_safecopyDstBeforeSrc(BYTE* op, BYTE const* ip, ptrdiff_t length) {
    ptrdiff_t const diff = op - ip;
    BYTE* const oend = op + length;

    if (length < 8 || diff > -8) {
        /* Handle short lengths, close overlaps, and dst not before src. */
        while (op < oend) *op++ = *ip++;
        return;
    }

    if (op <= oend - WILDCOPY_OVERLENGTH && diff < -WILDCOPY_VECLEN) {
        ZSTD_wildcopy(op, ip, oend - WILDCOPY_OVERLENGTH - op, ZSTD_no_overlap);
        ip += oend - WILDCOPY_OVERLENGTH - op;
        op += oend - WILDCOPY_OVERLENGTH - op;
    }

    /* Handle the leftovers. */
    while (op < oend) *op++ = *ip++;
}